

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
google::protobuf::internal::InternalMetadata::mutable_unknown_fields_slow<std::__cxx11::string>
          (InternalMetadata *this)

{
  ArenaMetricsCollector *pAVar1;
  undefined8 *puVar2;
  ArenaImpl *this_00;
  
  this_00 = (ArenaImpl *)this->ptr_;
  if (((ulong)this_00 & 1) != 0) {
    this_00 = *(ArenaImpl **)((ulong)this_00 & 0xfffffffffffffffe);
  }
  if (this_00 == (ArenaImpl *)0x0) {
    puVar2 = (undefined8 *)operator_new(0x28);
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2[2] = 0;
    puVar2[3] = 0;
  }
  else {
    if ((this_00->lifecycle_id_ & 1) != 0) {
      pAVar1 = this_00->options_->metrics_collector;
      (*pAVar1->_vptr_ArenaMetricsCollector[5])
                (pAVar1,&Container<std::__cxx11::string>::typeinfo,0x28);
    }
    puVar2 = (undefined8 *)
             ArenaImpl::AllocateAlignedAndAddCleanup
                       (this_00,0x28,
                        arena_destruct_object<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                       );
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2[2] = 0;
    puVar2[3] = 0;
  }
  puVar2[4] = 0;
  puVar2[1] = puVar2 + 3;
  *(undefined1 *)(puVar2 + 3) = 0;
  this->ptr_ = (void *)((ulong)puVar2 | 1);
  *puVar2 = this_00;
  return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar2 + 1);
}

Assistant:

PROTOBUF_NOINLINE T* mutable_unknown_fields_slow() {
    Arena* my_arena = arena();
    Container<T>* container = Arena::Create<Container<T>>(my_arena);
    // Two-step assignment works around a bug in clang's static analyzer:
    // https://bugs.llvm.org/show_bug.cgi?id=34198.
    ptr_ = container;
    ptr_ = reinterpret_cast<void*>(reinterpret_cast<intptr_t>(ptr_) |
                                   kTagContainer);
    container->arena = my_arena;
    return &(container->unknown_fields);
  }